

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

int install_bpf_program(pcap_t *p,bpf_program *fp)

{
  uint uVar1;
  int iVar2;
  bpf_insn *__dest;
  int *piVar3;
  char *pcVar4;
  size_t __size;
  
  iVar2 = bpf_validate(fp->bf_insns,fp->bf_len);
  if (iVar2 == 0) {
    builtin_strncpy(p->errbuf,"BPF program is not valid",0x19);
  }
  else {
    pcap_freecode(&p->fcode);
    uVar1 = fp->bf_len;
    (p->fcode).bf_len = uVar1;
    __size = (ulong)uVar1 << 3;
    __dest = (bpf_insn *)malloc(__size);
    (p->fcode).bf_insns = __dest;
    if (__dest != (bpf_insn *)0x0) {
      memcpy(__dest,fp->bf_insns,__size);
      return 0;
    }
    piVar3 = __errno_location();
    pcVar4 = pcap_strerror(*piVar3);
    snprintf(p->errbuf,0x101,"malloc: %s",pcVar4);
  }
  return -1;
}

Assistant:

int
install_bpf_program(pcap_t *p, struct bpf_program *fp)
{
	size_t prog_size;

	/*
	 * Validate the program.
	 */
	if (!bpf_validate(fp->bf_insns, fp->bf_len)) {
		pcap_snprintf(p->errbuf, sizeof(p->errbuf),
			"BPF program is not valid");
		return (-1);
	}

	/*
	 * Free up any already installed program.
	 */
	pcap_freecode(&p->fcode);

	prog_size = sizeof(*fp->bf_insns) * fp->bf_len;
	p->fcode.bf_len = fp->bf_len;
	p->fcode.bf_insns = (struct bpf_insn *)malloc(prog_size);
	if (p->fcode.bf_insns == NULL) {
		pcap_snprintf(p->errbuf, sizeof(p->errbuf),
			 "malloc: %s", pcap_strerror(errno));
		return (-1);
	}
	memcpy(p->fcode.bf_insns, fp->bf_insns, prog_size);
	return (0);
}